

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O1

void y4m_422jpeg_420jpeg_helper(uchar *_dst,uchar *_src,int _c_w,int _c_h)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uchar *puVar7;
  uint uVar8;
  uchar uVar9;
  int iVar10;
  uchar *puVar11;
  long lVar12;
  uchar *puVar13;
  uchar *puVar14;
  uint uVar15;
  ulong uVar16;
  uchar *puVar17;
  uchar *puVar18;
  uint uVar19;
  uchar *puVar20;
  uchar *puVar21;
  byte *local_80;
  
  if (0 < _c_w) {
    uVar3 = _c_h - 1;
    uVar4 = 1;
    if ((int)uVar3 < 1) {
      uVar4 = uVar3;
    }
    uVar5 = 2;
    if ((int)uVar3 < 2) {
      uVar5 = uVar3;
    }
    uVar8 = 3;
    if ((int)uVar3 < 3) {
      uVar8 = uVar3;
    }
    uVar6 = (ulong)(uint)_c_w;
    lVar2 = uVar6 * 2;
    lVar12 = 0;
    puVar17 = _dst;
    local_80 = _src;
    do {
      uVar15 = 0;
      if (0 < _c_h) {
        iVar10 = (int)((uint)local_80[(int)(uVar8 * _c_w)] + (uint)local_80[(int)(uVar8 * _c_w)] * 2
                       + (uint)local_80[(int)(uVar4 * _c_w)] * 0x4e + (uint)*local_80 * 0x40 +
                         (uint)local_80[(int)(uVar5 * _c_w)] * -0x11 + 0x40) >> 7;
        if (0xfe < iVar10) {
          iVar10 = 0xff;
        }
        uVar9 = (uchar)iVar10;
        if (iVar10 < 1) {
          uVar9 = '\0';
        }
        *puVar17 = uVar9;
        uVar15 = 2;
      }
      if ((int)uVar15 < _c_h + -3) {
        uVar16 = (ulong)uVar15;
        puVar14 = _src + (uVar16 + 1) * uVar6;
        puVar21 = _src + uVar6 * uVar16;
        puVar11 = _src + (uVar16 + 3) * uVar6;
        puVar7 = _src + (uVar16 - 2) * uVar6;
        puVar20 = _src + (uVar16 - 1) * uVar6;
        puVar13 = _dst + (uVar15 >> 1) * uVar6;
        puVar18 = _src + (uVar16 + 2) * uVar6;
        do {
          iVar10 = (int)(((uint)puVar11[lVar12] + (uint)puVar7[lVar12]) * 3 +
                         ((uint)puVar18[lVar12] + (uint)puVar20[lVar12]) * -0x11 +
                         ((uint)puVar14[lVar12] + (uint)puVar21[lVar12]) * 0x4e + 0x40) >> 7;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          uVar16 = uVar16 + 2;
          puVar13[lVar12] = (uchar)iVar10;
          puVar14 = puVar14 + lVar2;
          puVar21 = puVar21 + lVar2;
          puVar11 = puVar11 + lVar2;
          puVar7 = puVar7 + lVar2;
          puVar20 = puVar20 + lVar2;
          puVar13 = puVar13 + uVar6;
          puVar18 = puVar18 + lVar2;
        } while ((long)uVar16 < (long)(_c_h + -3));
        uVar15 = (uint)uVar16;
      }
      if ((int)uVar15 < _c_h) {
        uVar16 = (ulong)uVar15;
        puVar7 = _src + uVar6 * uVar16;
        puVar13 = _src + (uVar16 - 2) * uVar6;
        puVar14 = _src + (uVar16 - 1) * uVar6;
        puVar11 = _dst + (uVar15 >> 1) * uVar6;
        do {
          uVar1 = uVar16 + 2;
          uVar15 = uVar3;
          if ((int)(uint)uVar1 < (int)uVar3) {
            uVar15 = (uint)uVar1;
          }
          uVar19 = (uint)uVar16 | 1;
          if ((int)uVar3 <= (int)uVar19) {
            uVar19 = uVar3;
          }
          iVar10 = (int)(((uint)local_80[(int)(uVar3 * _c_w)] + (uint)puVar13[lVar12]) * 3 +
                         ((uint)local_80[(int)(uVar15 * _c_w)] + (uint)puVar14[lVar12]) * -0x11 +
                         ((uint)local_80[(int)(uVar19 * _c_w)] + (uint)puVar7[lVar12]) * 0x4e + 0x40
                        ) >> 7;
          if (0xfe < iVar10) {
            iVar10 = 0xff;
          }
          if (iVar10 < 1) {
            iVar10 = 0;
          }
          puVar11[lVar12] = (uchar)iVar10;
          puVar7 = puVar7 + lVar2;
          puVar13 = puVar13 + lVar2;
          puVar14 = puVar14 + lVar2;
          puVar11 = puVar11 + uVar6;
          uVar16 = uVar1;
        } while ((long)uVar1 < (long)_c_h);
      }
      local_80 = local_80 + 1;
      puVar17 = puVar17 + 1;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != _c_w);
  }
  return;
}

Assistant:

static void y4m_422jpeg_420jpeg_helper(unsigned char *_dst,
                                       const unsigned char *_src, int _c_w,
                                       int _c_h) {
  int y;
  int x;
  /*Filter: [3 -17 78 78 -17 3]/128, derived from a 6-tap Lanczos window.*/
  for (x = 0; x < _c_w; x++) {
    for (y = 0; y < OC_MINI(_c_h, 2); y += 2) {
      _dst[(y >> 1) * _c_w] =
          OC_CLAMPI(0,
                    (64 * _src[0] + 78 * _src[OC_MINI(1, _c_h - 1) * _c_w] -
                     17 * _src[OC_MINI(2, _c_h - 1) * _c_w] +
                     3 * _src[OC_MINI(3, _c_h - 1) * _c_w] + 64) >>
                        7,
                    255);
    }
    for (; y < _c_h - 3; y += 2) {
      _dst[(y >> 1) * _c_w] =
          OC_CLAMPI(0,
                    (3 * (_src[(y - 2) * _c_w] + _src[(y + 3) * _c_w]) -
                     17 * (_src[(y - 1) * _c_w] + _src[(y + 2) * _c_w]) +
                     78 * (_src[y * _c_w] + _src[(y + 1) * _c_w]) + 64) >>
                        7,
                    255);
    }
    for (; y < _c_h; y += 2) {
      _dst[(y >> 1) * _c_w] = OC_CLAMPI(
          0,
          (3 * (_src[(y - 2) * _c_w] + _src[(_c_h - 1) * _c_w]) -
           17 * (_src[(y - 1) * _c_w] + _src[OC_MINI(y + 2, _c_h - 1) * _c_w]) +
           78 * (_src[y * _c_w] + _src[OC_MINI(y + 1, _c_h - 1) * _c_w]) +
           64) >>
              7,
          255);
    }
    _src++;
    _dst++;
  }
}